

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  byte bVar2;
  char cVar3;
  Parse *pPVar4;
  ulong uVar5;
  ulong uVar6;
  WhereLoop **ppWVar7;
  SrcList *pSVar8;
  ExprList *pOrderBy;
  WhereInfo *pWInfo_00;
  byte bVar9;
  i8 iVar10;
  LogEst LVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int extraout_EAX;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  long lVar18;
  LogEst *pLVar19;
  WhereLoop **ppWVar20;
  uint uVar21;
  WhereLoop ***pppWVar22;
  ulong uVar23;
  LogEst *pLVar24;
  WhereLoop *pWVar25;
  WherePath *pPath;
  ushort uVar26;
  int iVar27;
  undefined6 in_register_00000032;
  WherePath *pWVar28;
  ushort *puVar29;
  short sVar30;
  undefined4 uVar31;
  ushort *puVar32;
  ulong uVar33;
  WherePath *pWVar34;
  bool bVar35;
  Bitmask revMask;
  Bitmask local_d8;
  ulong local_d0;
  uint local_c4;
  WhereInfo *local_c0;
  ulong local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  WhereLoop **local_a0;
  LogEst *local_98;
  ulong local_90;
  WherePath *local_88;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  uint local_70;
  uint local_6c;
  Parse *local_68;
  WherePath *local_60;
  ulong local_58;
  WherePath *local_50;
  LogEst *local_48;
  ulong local_40;
  size_t local_38;
  
  local_b0 = CONCAT62(in_register_00000032,nRowEst);
  pPVar4 = pWInfo->pParse;
  bVar2 = pWInfo->nLevel;
  puVar32 = (ushort *)(ulong)bVar2;
  local_90 = 1;
  if (1 < bVar2) {
    local_90 = (ulong)((uint)(bVar2 != 2) * 5 + 5);
  }
  iVar27 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    iVar27 = pWInfo->pOrderBy->nExpr;
  }
  iVar14 = (int)local_90;
  local_60 = (WherePath *)
             sqlite3DbMallocRawNN
                       (pPVar4->db,
                        (long)(int)((int)((long)iVar27 * 2) + ((uint)bVar2 * 8 + 0x20) * iVar14 * 2)
                       );
  if (local_60 == (WherePath *)0x0) {
    return 0;
  }
  uVar23 = (ulong)(uint)(iVar14 << 5);
  pPath = (WherePath *)((long)&local_60->maskLoop + uVar23);
  puVar1 = (undefined8 *)((long)&local_60->nRow + uVar23);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_60->maskLoop + uVar23);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_a0 = (WhereLoop **)((long)&pPath->maskLoop + uVar23);
  iVar14 = iVar14 * 2 + 1;
  pppWVar22 = &local_60->aLoop;
  do {
    *pppWVar22 = local_a0;
    iVar14 = iVar14 + -1;
    local_a0 = (WhereLoop **)((long)local_a0 + (ulong)((uint)bVar2 * 8));
    pppWVar22 = pppWVar22 + 4;
  } while (1 < iVar14);
  if (iVar27 == 0) {
    local_a0 = (WhereLoop **)0x0;
  }
  else {
    memset(local_a0,0,(long)iVar27 * 2);
  }
  uVar21._0_2_ = pPVar4->nQueryLoop;
  uVar21._2_1_ = pPVar4->eTriggerOp;
  uVar21._3_1_ = pPVar4->bReturning;
  pLVar19 = (LogEst *)0x30;
  if ((short)(undefined2)uVar21 < 0x30) {
    pLVar19 = (LogEst *)(ulong)uVar21;
  }
  pPath->nRow = (LogEst)pLVar19;
  if (iVar27 != 0) {
    pLVar19 = (LogEst *)(ulong)-(uint)bVar2;
    pPath->isOrdered = -(bVar2 != 0) | (byte)iVar27;
  }
  local_c0 = pWInfo;
  local_68 = pPVar4;
  if (puVar32 == (ushort *)0x0) {
    uVar21 = 1;
    pLVar24 = (LogEst *)0x0;
  }
  else {
    local_7c = (int)local_b0 - 10;
    local_78 = 2;
    if (2 < (uint)local_90) {
      local_78 = (uint)local_90;
    }
    uVar21 = 1;
    local_98 = (LogEst *)0x0;
    uVar17 = 0;
    uVar23 = 0;
    uVar33 = 0;
    local_50 = local_60;
    do {
      local_88 = local_50;
      if ((int)uVar21 < 1) {
        uVar21 = 0;
        local_50 = pPath;
      }
      else {
        local_38 = (long)local_98 * 8;
        local_48 = &local_50[1].rUnsorted;
        uVar16 = 0;
        pLVar19 = (LogEst *)((ulong)local_98 & 0xffff);
        local_74 = SUB84(pLVar19,0);
        pLVar24 = (LogEst *)0x0;
        local_70 = uVar21;
        local_50 = pPath;
        do {
          local_6c = uVar16;
          for (pWVar25 = local_c0->pLoops; uVar21 = (uint)pLVar24, pWVar25 != (WhereLoop *)0x0;
              pWVar25 = pWVar25->pNextLoop) {
            uVar5 = pPath->maskLoop;
            if ((((pWVar25->prereq & ~uVar5) == 0) &&
                (uVar6 = pWVar25->maskSelf, (uVar6 & uVar5) == 0)) &&
               (((pWVar25->wsFlags & 0x4000) == 0 || (2 < pPath->nRow)))) {
              sVar30 = pPath->nRow;
              local_c4 = uVar21;
              local_b8 = uVar23;
              LVar11 = sqlite3LogEstAdd(pWVar25->rSetup,pWVar25->rRun + sVar30);
              sVar12 = sqlite3LogEstAdd(LVar11,pPath->rUnsorted);
              uVar26 = sVar30 + pWVar25->nOut;
              bVar9 = pPath->isOrdered;
              local_d0 = uVar33;
              if ((char)bVar9 < '\0') {
                local_d8 = 0;
                pLVar19 = (LogEst *)(ulong)local_c0->wctrlFlags;
                bVar9 = wherePathSatisfiesOrderBy
                                  (local_c0,local_c0->pOrderBy,pPath,local_c0->wctrlFlags,
                                   (u16)local_74,pWVar25,&local_d8);
              }
              else {
                local_d8 = pPath->revLoop;
              }
              ppWVar20 = (WhereLoop **)CONCAT71((int7)((ulong)pLVar19 >> 8),(char)bVar9 < '\0');
              iVar14 = iVar27 - (char)bVar9;
              uVar31 = (undefined4)CONCAT62(extraout_var,sVar12);
              if ((iVar14 == 0 || iVar27 < (char)bVar9) || (char)bVar9 < '\0') {
                sVar30 = sVar12 + -2;
              }
              else {
                uVar23 = (ulong)bVar9;
                if (*(short *)((long)local_a0 + uVar23 * 2) == 0) {
                  iVar15 = local_c0->pSelect->pEList->nExpr;
                  iVar15 = iVar15 + (int)((ulong)((long)(iVar15 + 0x3b) * -0x77777777) >> 0x20) +
                           0x3b;
                  local_a4 = uVar31;
                  local_58 = uVar23;
                  LVar11 = sqlite3LogEst((long)((iVar15 >> 4) - (iVar15 >> 0x1f)));
                  uVar21 = (int)CONCAT62(extraout_var_00,LVar11) + (int)local_b0;
                  if ('\0' < (char)bVar9) {
                    local_40 = (ulong)uVar21;
                    uVar13 = sqlite3LogEst((long)((iVar14 * 100) / iVar27));
                    uVar21 = ((int)local_40 + (uint)uVar13) - 0x42;
                  }
                  sVar30 = (short)uVar21;
                  uVar21 = (uint)local_b0;
                  if ((local_c0->wctrlFlags >> 0xe & 1) == 0) {
                    uVar16 = uVar21;
                    if ((local_c0->wctrlFlags & 0x100) != 0) {
                      uVar16 = local_7c;
                    }
                    if ((short)local_b0 < 0xb) {
                      uVar16 = uVar21;
                    }
                  }
                  else {
                    sVar12 = sVar30 + 0x10;
                    sVar30 = sVar30 + 10;
                    if (bVar9 != 0) {
                      sVar30 = sVar12;
                    }
                    uVar16 = (uint)(ushort)local_c0->iLimit;
                    if ((short)local_b0 <= local_c0->iLimit) {
                      uVar16 = uVar21;
                    }
                  }
                  if ((short)uVar16 < 0xb) {
                    sVar12 = 0;
                  }
                  else {
                    LVar11 = sqlite3LogEst((ulong)(uVar16 & 0xffff));
                    sVar12 = LVar11 + -0x21;
                  }
                  *(short *)((long)local_a0 + local_58 * 2) = sVar12 + sVar30;
                  ppWVar20 = local_a0;
                  uVar23 = local_58;
                  uVar31 = local_a4;
                }
                sVar30 = (short)uVar31;
                LVar11 = sqlite3LogEstAdd(sVar30,*(LogEst *)((long)local_a0 + uVar23 * 2));
                sVar12 = LVar11 + 3;
              }
              pLVar24 = (LogEst *)(ulong)local_c4;
              pLVar19 = (LogEst *)CONCAT71((int7)((ulong)ppWVar20 >> 8),0 < (int)local_c4);
              iVar14 = (int)local_90;
              uVar23 = local_b8;
              uVar33 = local_d0;
              if (0 < (int)local_c4) {
                pWVar34 = local_88;
                uVar21 = 1;
                do {
                  if ((pWVar34->maskLoop == (uVar6 | uVar5)) &&
                     (-1 < (char)(pWVar34->isOrdered ^ bVar9))) {
                    if ((char)pLVar19 != '\0') {
                      if (pWVar34->rCost < sVar12) goto LAB_001853a9;
                      if (pWVar34->rCost != sVar12) goto LAB_0018563a;
                      pLVar19 = (LogEst *)(ulong)uVar26;
                      if ((pWVar34->nRow < (short)uVar26) ||
                         ((pWVar34->nRow == uVar26 && (pWVar34->rUnsorted <= sVar30))))
                      goto LAB_001853a9;
                      goto LAB_0018563a;
                    }
                    break;
                  }
                  pWVar34 = pWVar34 + 1;
                  pLVar19 = (LogEst *)
                            CONCAT71((int7)((ulong)pLVar19 >> 8),(int)uVar21 < (int)local_c4);
                  bVar35 = uVar21 != local_c4;
                  uVar21 = uVar21 + 1;
                } while (bVar35);
              }
              uVar21 = local_c4;
              if (iVar14 <= (int)local_c4) {
                pLVar19 = pLVar24;
                if ((short)local_b8 < sVar12) goto LAB_001853a9;
                uVar21 = uVar17;
                if (sVar12 == (short)local_b8) {
                  pLVar19 = (LogEst *)(ulong)uVar17;
                  if ((short)local_d0 <= sVar30) goto LAB_001853a9;
                }
              }
              pLVar24 = (LogEst *)(ulong)(local_c4 + ((int)local_c4 < iVar14));
              pWVar34 = local_88 + (int)uVar21;
LAB_0018563a:
              pWVar34->maskLoop = pWVar25->maskSelf | pPath->maskLoop;
              pWVar34->revLoop = local_d8;
              pWVar34->nRow = uVar26;
              pWVar34->rCost = sVar12;
              pWVar34->rUnsorted = sVar30;
              pWVar34->isOrdered = bVar9;
              memcpy(pWVar34->aLoop,pPath->aLoop,local_38);
              pWVar34->aLoop[(long)local_98] = pWVar25;
              pLVar19 = local_98;
              uVar23 = local_b8;
              uVar33 = local_d0;
              if (iVar14 <= (int)pLVar24) {
                uVar17 = 0;
                uVar33 = (ulong)(ushort)local_88->nRow;
                uVar23 = (ulong)(ushort)local_88->rCost;
                if (1 < bVar2) {
                  uVar17 = 0;
                  uVar21 = 1;
                  pLVar19 = local_48;
                  do {
                    uVar26 = pLVar19[-1];
                    if (((short)(ushort)uVar23 < (short)uVar26) ||
                       ((uVar26 == (ushort)uVar23 && ((short)uVar33 < *pLVar19)))) {
                      uVar33 = (ulong)(ushort)*pLVar19;
                      uVar23 = (ulong)uVar26;
                      uVar17 = uVar21;
                    }
                    uVar21 = uVar21 + 1;
                    pLVar19 = pLVar19 + 0x10;
                  } while (local_78 != uVar21);
                }
              }
            }
LAB_001853a9:
          }
          uVar16 = local_6c + 1;
          pPath = pPath + 1;
        } while (uVar16 != local_70);
      }
      pLVar24 = (LogEst *)((long)local_98 + 1);
      pPath = local_88;
      local_98 = pLVar24;
    } while ((ushort *)pLVar24 != puVar32);
  }
  pPVar4 = local_68;
  pWInfo_00 = local_c0;
  if (uVar21 == 0) {
    sqlite3ErrorMsg(local_68,"no query solution",pLVar24,pLVar19);
  }
  else {
    if (1 < (int)uVar21) {
      lVar18 = (ulong)uVar21 - 1;
      pWVar28 = pPath;
      pWVar34 = pPath;
      do {
        pPath = pWVar34 + 1;
        if (pWVar28->rCost <= pWVar34[1].rCost) {
          pPath = pWVar28;
        }
        lVar18 = lVar18 + -1;
        pWVar28 = pPath;
        pWVar34 = pWVar34 + 1;
      } while (lVar18 != 0);
    }
    if (puVar32 != (ushort *)0x0) {
      ppWVar7 = pPath->aLoop;
      pSVar8 = local_c0->pTabList;
      ppWVar20 = &local_c0->a[0].pWLoop;
      puVar29 = (ushort *)0x0;
      do {
        pWVar25 = ppWVar7[(long)puVar29];
        *ppWVar20 = pWVar25;
        bVar9 = pWVar25->iTab;
        *(byte *)(ppWVar20 + -4) = bVar9;
        *(int *)((long)ppWVar20 + -0x5c) = pSVar8->a[bVar9].iCursor;
        puVar29 = (ushort *)((long)puVar29 + 1);
        ppWVar20 = ppWVar20 + 0xe;
      } while (puVar32 != puVar29);
    }
    if (((((local_c0->wctrlFlags & 0x180) == 0x100) && ((short)local_b0 != 0)) &&
        (local_c0->eDistinct == '\0')) &&
       (iVar10 = wherePathSatisfiesOrderBy
                           (local_c0,local_c0->pResultSet,pPath,0x80,bVar2 - 1,
                            pPath->aLoop[(long)puVar32 + -1],&local_d8),
       pWInfo_00->pResultSet->nExpr == (int)iVar10)) {
      pWInfo_00->eDistinct = '\x02';
    }
    bVar9 = pWInfo_00->field_0x44;
    pWInfo_00->field_0x44 = bVar9 & 0xfb;
    pOrderBy = pWInfo_00->pOrderBy;
    if (pOrderBy != (ExprList *)0x0) {
      cVar3 = pPath->isOrdered;
      pWInfo_00->nOBSat = cVar3;
      if ((char)pWInfo_00->wctrlFlags < '\0') {
        if (pOrderBy->nExpr == (int)cVar3) {
          pWInfo_00->eDistinct = '\x02';
        }
      }
      else {
        pWInfo_00->revMask = pPath->revLoop;
        if (cVar3 < '\x01') {
          pWInfo_00->nOBSat = '\0';
          if (puVar32 != (ushort *)0x0) {
            uVar17 = bVar2 - 1;
            uVar21 = pPath->aLoop[uVar17]->wsFlags;
            if ((~uVar21 & 0x104) != 0 && (uVar21 >> 0xc & 1) == 0) {
              local_d8 = 0;
              iVar10 = wherePathSatisfiesOrderBy
                                 (pWInfo_00,pOrderBy,pPath,0x800,(u16)uVar17,pPath->aLoop[uVar17],
                                  &local_d8);
              if (pWInfo_00->pOrderBy->nExpr == (int)iVar10) {
                pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 4;
                pWInfo_00->revMask = local_d8;
              }
            }
          }
        }
        else if (((pWInfo_00->wctrlFlags & 3) != 0 && puVar32 != (ushort *)0x0) && cVar3 == '\x01')
        {
          pWInfo_00->field_0x44 = bVar9 | 4;
        }
      }
      if ((((pWInfo_00->wctrlFlags & 0x200) != 0) && (puVar32 != (ushort *)0x0)) &&
         (pWInfo_00->pOrderBy->nExpr == (int)pWInfo_00->nOBSat)) {
        local_d8 = 0;
        uVar21 = bVar2 - 1;
        iVar10 = wherePathSatisfiesOrderBy
                           (pWInfo_00,pWInfo_00->pOrderBy,pPath,0,(u16)uVar21,pPath->aLoop[uVar21],
                            &local_d8);
        if (pWInfo_00->pOrderBy->nExpr == (int)iVar10) {
          pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 8;
          pWInfo_00->revMask = local_d8;
        }
      }
    }
    pWInfo_00->nRowOut = pPath->nRow;
  }
  sqlite3DbFreeNN(pPVar4->db,local_60);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}